

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

bool __thiscall Clasp::MovingAvg::push(MovingAvg *this,uint32 val)

{
  uint64 uVar1;
  uint64 uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar3 = *(uint *)&this->field_0x14;
  if ((uVar3 & 0x1fffffff) == 0) {
    uVar2 = (this->extra_).num;
    uVar1 = uVar2 + 1;
    (this->extra_).num = uVar1;
    auVar8._8_4_ = (int)(uVar2 >> 0x20);
    auVar8._0_8_ = uVar2;
    auVar8._12_4_ = 0x45300000;
    auVar7._8_4_ = (int)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = 0x45300000;
    dVar5 = (((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * this->avg_ +
            (double)val) /
            ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  }
  else if ((uVar3 >> 0x1e & 1) == 0) {
    dVar5 = sma(this->avg_,val,(this->extra_).sma,uVar3 & 0x1fffffff,this->pos_,
                (bool)((byte)(uVar3 >> 0x1d) & 1));
  }
  else if ((uVar3 >> 0x1d & 1) == 0) {
    dVar5 = this->avg_;
    if ((int)uVar3 < 0) {
      dVar6 = smoothAlpha((this->extra_).alpha,this->pos_);
      dVar5 = ((double)val - dVar5) * dVar6 + dVar5;
    }
    else {
      dVar5 = (dVar5 * (double)this->pos_ + (double)val) / (double)((ulong)this->pos_ + 1);
    }
  }
  else {
    dVar5 = ((double)val - this->avg_) * (this->extra_).alpha + this->avg_;
  }
  this->avg_ = dVar5;
  uVar3 = *(uint *)&this->field_0x14;
  uVar4 = this->pos_ + 1;
  this->pos_ = uVar4;
  if (uVar4 == (uVar3 & 0x1fffffff)) {
    this->pos_ = 0;
    uVar3 = uVar3 | 0x20000000;
    *(uint *)&this->field_0x14 = uVar3;
  }
  return (bool)((byte)(uVar3 >> 0x1d) & 1);
}

Assistant:

bool push(uint32 val) {
		if      (!win_)   { avg_ = cma(avg_, val, extra_.num++); }
		else if (!ema_)   { avg_ = sma(avg_, val, extra_.sma, win_, pos_, valid()); }
		else if (valid()) { avg_ = ema(avg_, val, extra_.alpha); }
		else              { avg_ = smooth_ ? ema(avg_, val, smoothAlpha(extra_.alpha, pos_)) : cma(avg_, val, pos_); }
		if (++pos_ == win_) { pos_ = 0; full_ = 1; }
		return valid();
	}